

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVirtualProtocol.h
# Opt level: O3

uint32_t __thiscall
duckdb_apache::thrift::protocol::
TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::SimpleReadTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
::readBool(TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::SimpleReadTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
           *this,reference value)

{
  _func_int **pp_Var1;
  undefined8 in_RAX;
  ulong uVar2;
  uint32_t uVar3;
  ulong *puVar4;
  uint8_t b [1];
  char local_21;
  
  local_21 = (char)((ulong)in_RAX >> 0x38);
  puVar4 = value._M_p;
  if ((char)this[1].super_TProtocolDefaults.super_TProtocol.input_recursion_depth_ == '\x01') {
    *(undefined1 *)&this[1].super_TProtocolDefaults.super_TProtocol.input_recursion_depth_ = 0;
    uVar3 = 0;
    if (*(char *)((long)&this[1].super_TProtocolDefaults.super_TProtocol.input_recursion_depth_ + 1)
        != '\0') {
LAB_01bce39d:
      uVar2 = value._M_mask | *puVar4;
      goto LAB_01bce3a0;
    }
  }
  else {
    pp_Var1 = this[1].super_TProtocolDefaults.super_TProtocol._vptr_TProtocol;
    uVar3 = 1;
    (**(code **)(*pp_Var1 + 0x38))(pp_Var1,&local_21,1);
    if (local_21 == '\x01') goto LAB_01bce39d;
  }
  uVar2 = ~value._M_mask & *puVar4;
LAB_01bce3a0:
  *puVar4 = uVar2;
  return uVar3;
}

Assistant:

uint32_t readBool(duckdb::vector<bool>::reference value) {
    bool b = false;
    uint32_t ret = static_cast<Protocol_*>(this)->readBool(b);
    value = b;
    return ret;
  }